

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void ft_glyphslot_free_bitmap(FT_GlyphSlot slot)

{
  FT_Memory memory;
  FT_GlyphSlot slot_local;
  
  if ((slot->internal == (FT_Slot_Internal)0x0) || ((slot->internal->flags & 1) == 0)) {
    (slot->bitmap).buffer = (uchar *)0x0;
  }
  else {
    ft_mem_free(slot->face->memory,(slot->bitmap).buffer);
    (slot->bitmap).buffer = (uchar *)0x0;
    slot->internal->flags = slot->internal->flags & 0xfffffffe;
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  ft_glyphslot_free_bitmap( FT_GlyphSlot  slot )
  {
    if ( slot->internal && ( slot->internal->flags & FT_GLYPH_OWN_BITMAP ) )
    {
      FT_Memory  memory = FT_FACE_MEMORY( slot->face );


      FT_FREE( slot->bitmap.buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }
    else
    {
      /* assume that the bitmap buffer was stolen or not */
      /* allocated from the heap                         */
      slot->bitmap.buffer = NULL;
    }
  }